

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::NeedRelinkBeforeInstall(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  LinkClosure *pLVar6;
  string *psVar7;
  ostream *poVar8;
  cmake *this_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string flagVar;
  string ll;
  ostringstream w;
  string local_1f0;
  undefined1 local_1d0 [16];
  cmLocalGenerator *local_1c0;
  cmGlobalGenerator *local_1b8;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Base_ptr local_180;
  _Base_ptr local_178;
  ios_base local_130 [264];
  
  TVar4 = cmTarget::GetType(this->Target);
  if ((((TVar4 != EXECUTABLE) && (TVar4 = cmTarget::GetType(this->Target), TVar4 != SHARED_LIBRARY))
      && (TVar4 = cmTarget::GetType(this->Target), TVar4 != MODULE_LIBRARY)) ||
     (bVar2 = cmTarget::GetHaveInstallRule(this->Target), !bVar2)) {
    return false;
  }
  this_00 = this->Makefile;
  local_1a0._0_8_ = &local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"CMAKE_SKIP_RPATH","");
  bVar2 = cmMakefile::IsOn(this_00,(string *)local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._0_8_ != &local_190) {
    operator_delete((void *)local_1a0._0_8_,local_190._M_allocated_capacity + 1);
  }
  if (bVar2) {
    return false;
  }
  local_1a0._0_8_ = &local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"BUILD_WITH_INSTALL_RPATH","")
  ;
  bVar2 = cmTarget::GetPropertyAsBool(this->Target,(string *)local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._0_8_ != &local_190) {
    operator_delete((void *)local_1a0._0_8_,local_190._M_allocated_capacity + 1);
  }
  if (bVar2) {
    return false;
  }
  bVar2 = IsChrpathUsed(this,config);
  if (bVar2) {
    return false;
  }
  pLVar6 = GetLinkClosure(this,config);
  pcVar1 = (pLVar6->LinkerLanguage)._M_dataplus._M_p;
  local_1c0 = (cmLocalGenerator *)local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,pcVar1,pcVar1 + (pLVar6->LinkerLanguage)._M_string_length);
  if (local_1b8 != (cmGlobalGenerator *)0x0) {
    local_1a0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1d;
    local_1a0._8_8_ = "CMAKE_SHARED_LIBRARY_RUNTIME_";
    local_190._M_allocated_capacity = (size_type)local_1b8;
    local_190._8_8_ = local_1c0;
    local_180 = (_Base_ptr)0x5;
    local_178 = (_Base_ptr)0x7928c8;
    views._M_len = 3;
    views._M_array = (iterator)local_1a0;
    cmCatViews_abi_cxx11_(&local_1f0,views);
    bVar2 = cmMakefile::IsSet(this->Makefile,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      bVar2 = HaveBuildTreeRPATH(this,config);
      bVar3 = true;
      if (!bVar2) {
        bVar3 = HaveInstallTreeRPATH(this,config);
      }
      iVar5 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x2a])();
      if (((byte)iVar5 & bVar3) == 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"The install of the ",0x13);
        psVar7 = cmTarget::GetName_abi_cxx11_(this->Target);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,
                   " target requires changing an RPATH from the build tree, but this is not supported with the Ninja generator unless on an ELF-based or XCOFF-based platform.  The CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this relinking step."
                   ,0xf0);
        this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::stringbuf::str();
        GetBacktrace((cmGeneratorTarget *)local_1d0);
        cmake::IssueMessage(this_01,FATAL_ERROR,&local_1f0,(cmListFileBacktrace *)local_1d0);
        if ((cmMakefile *)local_1d0._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        std::ios_base::~ios_base(local_130);
      }
      goto LAB_004a7a64;
    }
  }
  bVar3 = false;
LAB_004a7a64:
  if (local_1c0 != (cmLocalGenerator *)local_1b0) {
    operator_delete(local_1c0,(ulong)(local_1b0._0_8_ + 1));
    return bVar3;
  }
  return bVar3;
}

Assistant:

bool cmGeneratorTarget::NeedRelinkBeforeInstall(
  const std::string& config) const
{
  // Only executables and shared libraries can have an rpath and may
  // need relinking.
  if (this->GetType() != cmStateEnums::EXECUTABLE &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY) {
    return false;
  }

  // If there is no install location this target will not be installed
  // and therefore does not need relinking.
  if (!this->Target->GetHaveInstallRule()) {
    return false;
  }

  // If skipping all rpaths completely then no relinking is needed.
  if (this->Makefile->IsOn("CMAKE_SKIP_RPATH")) {
    return false;
  }

  // If building with the install-tree rpath no relinking is needed.
  if (this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH")) {
    return false;
  }

  // If chrpath is going to be used no relinking is needed.
  if (this->IsChrpathUsed(config)) {
    return false;
  }

  // Check for rpath support on this platform.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    std::string flagVar =
      cmStrCat("CMAKE_SHARED_LIBRARY_RUNTIME_", ll, "_FLAG");
    if (!this->Makefile->IsSet(flagVar)) {
      // There is no rpath support on this platform so nothing needs
      // relinking.
      return false;
    }
  } else {
    // No linker language is known.  This error will be reported by
    // other code.
    return false;
  }

  // If either a build or install tree rpath is set then the rpath
  // will likely change between the build tree and install tree and
  // this target must be relinked.
  bool have_rpath =
    this->HaveBuildTreeRPATH(config) || this->HaveInstallTreeRPATH(config);
  bool is_ninja = this->LocalGenerator->GetGlobalGenerator()->IsNinja();

  if (have_rpath && is_ninja) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      "The install of the " << this->GetName() << " target requires changing "
      "an RPATH from the build tree, but this is not supported with the Ninja "
      "generator unless on an ELF-based or XCOFF-based platform.  "
      "The CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this "
      "relinking step."
      ;
    /* clang-format on */

    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return have_rpath;
}